

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

void __thiscall GlobOptBlockData::SetChangedSym(GlobOptBlockData *this,SymID symId)

{
  if (this->changedSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,symId);
    if (this->capturedValuesCandidate != (CapturedValues *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->globOpt->changedSymsAfterIncBailoutCandidate,symId);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::SetChangedSym(SymID symId)
{
    // this->currentBlock might not be the one which contain the changing symId,
    // like hoisting invariant, but more changed symId is overly conservative and safe.
    // symId in the hoisted to block is marked as JITOptimizedReg so it does't affect bailout.
    if (this->changedSyms)
    {
        this->changedSyms->Set(symId);
        if (this->capturedValuesCandidate != nullptr)
        {
            this->globOpt->changedSymsAfterIncBailoutCandidate->Set(symId);
        }
    }
    // else could be hit only in MergeValues and it is handled by MergeCapturedValues
}